

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abeta.hpp
# Opt level: O0

double minimax::ABeta_<uttt::IBoard,uttt::Eval1>(IBoard *game,int depth,double alfa,double beta)

{
  bool bVar1;
  IPlayer IVar2;
  bool bVar3;
  int iVar4;
  double *pdVar5;
  int in_ESI;
  IBoard *in_RDI;
  double in_XMM0_Qa;
  double dVar6;
  double in_XMM1_Qa;
  double r;
  IBoard new_game;
  long m;
  iterator __end0;
  iterator __begin0;
  vector<long,_std::allocator<long>_> *__range2;
  vector<long,_std::allocator<long>_> moves;
  double result;
  bool result_set;
  int status;
  Eval1 evaluator;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffff38;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  IBoard *in_stack_ffffffffffffff50;
  Eval1 *in_stack_ffffffffffffff58;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_68;
  undefined1 *local_60;
  IBoard *in_stack_ffffffffffffffa8;
  IBoard *local_40;
  undefined4 in_stack_ffffffffffffffd4;
  int depth_00;
  undefined4 in_stack_ffffffffffffffe8;
  IBoard *local_8;
  
  if (in_ESI == 0) {
    local_8 = (IBoard *)uttt::Eval1::operator()(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50)
    ;
  }
  else {
    iVar4 = uttt::IBoard::GetStatus(in_RDI);
    if (iVar4 == -1) {
      bVar1 = false;
      local_40 = (IBoard *)0x0;
      uttt::IBoard::GetPossibleMoves(in_stack_ffffffffffffffa8);
      local_60 = &stack0xffffffffffffffa8;
      local_68._M_current =
           (long *)std::vector<long,_std::allocator<long>_>::begin(in_stack_ffffffffffffff38);
      std::vector<long,_std::allocator<long>_>::end(in_stack_ffffffffffffff38);
      while (depth_00 = (int)((ulong)in_XMM0_Qa >> 0x20),
            bVar3 = __gnu_cxx::operator!=
                              (in_stack_ffffffffffffff40,
                               (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                *)in_stack_ffffffffffffff38), bVar3) {
        __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator*
                  (&local_68);
        uttt::IBoard::ApplyMove
                  (in_stack_ffffffffffffff50,
                   (IMove *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        in_stack_ffffffffffffff40 =
             (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
             ABeta_<uttt::IBoard,uttt::Eval1>
                       ((IBoard *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),depth_00,in_XMM1_Qa,
                        (double)CONCAT44(in_stack_ffffffffffffffd4,iVar4));
        in_stack_ffffffffffffff50 = (IBoard *)-(double)in_stack_ffffffffffffff40;
        if ((!bVar1) || ((double)local_40 < (double)in_stack_ffffffffffffff50)) {
          bVar1 = true;
          local_40 = in_stack_ffffffffffffff50;
        }
        pdVar5 = std::max<double>((double *)&stack0xffffffffffffffe0,
                                  (double *)&stack0xffffffffffffff50);
        in_XMM0_Qa = *pdVar5;
        if (in_XMM1_Qa <= in_XMM0_Qa) break;
        __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
                  (&local_68);
      }
      local_8 = local_40;
      std::vector<long,_std::allocator<long>_>::~vector
                ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffff50);
    }
    else if (iVar4 == 0) {
      local_8 = (IBoard *)0x0;
    }
    else {
      IVar2 = uttt::IBoard::GetPlayerToMove(in_RDI);
      if (iVar4 == IVar2) {
        local_8 = (IBoard *)std::numeric_limits<double>::max();
      }
      else {
        dVar6 = std::numeric_limits<double>::max();
        local_8 = (IBoard *)((ulong)dVar6 ^ 0x8000000000000000);
      }
    }
  }
  return (double)local_8;
}

Assistant:

static double
ABeta_(const IGame &game, int depth, double alfa, double beta)
{
    Eval evaluator;

    if (depth == 0)
        return evaluator(game);

    auto status = game.GetStatus();
    if (status != game::Undecided)
    {
        if (status == game::Draw)
            return 0.0;
        if (status == game.GetPlayerToMove())
            return std::numeric_limits<double>::max();
        return -std::numeric_limits<double>::max();
    }

    bool result_set = false;
    double result = 0.0;
    auto moves = game.GetPossibleMoves();
    for (auto m : moves)
    {
        IGame new_game(game);
        new_game.ApplyMove(m);
        auto r = -ABeta_<IGame, Eval>(new_game, depth - 1, -beta, -alfa);
        if (!result_set || r > result)
            result = r, result_set = true;
        alfa = std::max(alfa, r);
        if (alfa >= beta)
            break;
    }

    return result;
}